

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *this,arrays_type *new_arrays_)

{
  size_t sVar1;
  value_type_pointer ppVar2;
  size_t sVar3;
  size_t num_destroyed;
  size_t local_30;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
  *local_28;
  arrays_type *local_20;
  size_t *local_18;
  
  local_18 = &local_30;
  local_30 = 0;
  local_28 = this;
  local_20 = new_arrays_;
  for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6916:41)>
            (&this->arrays,(anon_class_24_3_45a051ed *)&local_28);
  if (local_30 != (this->size_ctrl).size) {
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
    ::
    for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>::unchecked_rehash(boost::unordered::detail::foa::table_arrays<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>&)::_lambda(std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>*)_3_>
              (&this->arrays,(anon_class_8_1_8991fb9c)this);
  }
  delete_arrays(this,&this->arrays);
  sVar3 = new_arrays_->groups_size_index;
  sVar1 = new_arrays_->groups_size_mask;
  ppVar2 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = ppVar2;
  (this->arrays).groups_size_index = sVar3;
  (this->arrays).groups_size_mask = sVar1;
  sVar3 = initial_max_load(this);
  (this->size_ctrl).ml = sVar3;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }